

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O3

DisasJumpType op_vpdi(DisasContext_conflict13 *s,DisasOps *o)

{
  byte bVar1;
  TCGContext_conflict12 *s_00;
  TCGTemp *pTVar2;
  TCGTemp *pTVar3;
  uintptr_t o_2;
  TCGv_i64 dst;
  uintptr_t o_1;
  TCGv_i64 dst_00;
  
  if (((s->fields).presentO & 0x20) != 0) {
    s_00 = s->uc->tcg_ctx;
    bVar1 = (byte)(s->fields).c[3];
    pTVar2 = tcg_temp_new_internal_s390x(s_00,TCG_TYPE_I64,false);
    pTVar3 = tcg_temp_new_internal_s390x(s_00,TCG_TYPE_I64,false);
    if (((s->fields).presentO & 0x800000) != 0) {
      dst_00 = (TCGv_i64)((long)pTVar2 - (long)s_00);
      read_vec_element_i64(s_00,dst_00,(uint8_t)(s->fields).c[6],bVar1 >> 2 & 1,MO_64);
      if (((s->fields).presentO & 0x1000000) != 0) {
        dst = (TCGv_i64)((long)pTVar3 - (long)s_00);
        read_vec_element_i64(s_00,dst,(uint8_t)(s->fields).c[2],bVar1 & 1,MO_64);
        if (((s->fields).presentO & 0x400000) != 0) {
          write_vec_element_i64(s_00,dst_00,(s->fields).c[0],'\0',MO_64);
          if (((s->fields).presentO & 0x400000) != 0) {
            write_vec_element_i64(s_00,dst,(s->fields).c[0],'\x01',MO_64);
            tcg_temp_free_internal_s390x(s_00,(TCGTemp *)(dst_00 + (long)s_00));
            tcg_temp_free_internal_s390x(s_00,(TCGTemp *)(dst + (long)s_00));
            return DISAS_NEXT;
          }
        }
      }
    }
  }
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_vpdi(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t i2 = extract32(get_field(s, m4), 2, 1);
    const uint8_t i3 = extract32(get_field(s, m4), 0, 1);
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);

    read_vec_element_i64(tcg_ctx, t0, get_field(s, v2), i2, ES_64);
    read_vec_element_i64(tcg_ctx, t1, get_field(s, v3), i3, ES_64);
    write_vec_element_i64(tcg_ctx, t0, get_field(s, v1), 0, ES_64);
    write_vec_element_i64(tcg_ctx, t1, get_field(s, v1), 1, ES_64);
    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
    return DISAS_NEXT;
}